

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_db_release_memory(sqlite3 *db)

{
  Btree *p;
  long in_RDI;
  Pager *pPager;
  Btree *pBt;
  int i;
  undefined4 local_c;
  
  sqlite3_mutex_enter((sqlite3_mutex *)0x14a213);
  sqlite3BtreeEnterAll((sqlite3 *)0x14a21d);
  for (local_c = 0; local_c < *(int *)(in_RDI + 0x28); local_c = local_c + 1) {
    p = *(Btree **)(*(long *)(in_RDI + 0x20) + (long)local_c * 0x20 + 8);
    if (p != (Btree *)0x0) {
      sqlite3BtreePager(p);
      sqlite3PagerShrink((Pager *)0x14a272);
    }
  }
  sqlite3BtreeLeaveAll((sqlite3 *)0x14a28b);
  sqlite3_mutex_leave((sqlite3_mutex *)0x14a299);
  return 0;
}

Assistant:

SQLITE_API int sqlite3_db_release_memory(sqlite3 *db){
  int i;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(db->mutex);
  sqlite3BtreeEnterAll(db);
  for(i=0; i<db->nDb; i++){
    Btree *pBt = db->aDb[i].pBt;
    if( pBt ){
      Pager *pPager = sqlite3BtreePager(pBt);
      sqlite3PagerShrink(pPager);
    }
  }
  sqlite3BtreeLeaveAll(db);
  sqlite3_mutex_leave(db->mutex);
  return SQLITE_OK;
}